

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zip_read_data_zipx_ppmd(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  wchar_t wVar1;
  int iVar2;
  long lStack_50;
  wchar_t sym;
  ssize_t bytes_avail;
  size_t consumed_bytes;
  zip *pzStack_38;
  wchar_t ret;
  zip *zip;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  pzStack_38 = (zip *)a->format->data;
  bytes_avail = 0;
  lStack_50 = 0;
  zip = (zip *)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  if (pzStack_38->decompress_init == '\0') {
    wVar1 = zipx_ppmd8_init(a,pzStack_38);
    if (wVar1 != L'\0') {
      return wVar1;
    }
    consumed_bytes._4_4_ = 0;
  }
  __archive_read_ahead((archive_read *)buff_local,1,&stack0xffffffffffffffb0);
  if (lStack_50 < 0) {
    archive_set_error((archive *)buff_local,0x54,"Truncated PPMd8 file body");
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    pzStack_38->zipx_ppmd_read_compressed = 0;
    do {
      iVar2 = Ppmd8_DecodeSymbol(&pzStack_38->ppmd8);
      if (iVar2 < 0) {
        pzStack_38->end_of_entry = '\x01';
        break;
      }
      if (pzStack_38->ppmd8_stream_failed != '\0') {
        archive_set_error((archive *)buff_local,0x54,"Truncated PPMd8 file body");
        return L'\xffffffe2';
      }
      pzStack_38->uncompressed_buffer[bytes_avail] = (uchar)iVar2;
      bytes_avail = bytes_avail + 1;
    } while ((ulong)bytes_avail < pzStack_38->uncompressed_buffer_size);
    pzStack_38->entry_bytes_remaining =
         pzStack_38->entry_bytes_remaining - pzStack_38->zipx_ppmd_read_compressed;
    pzStack_38->entry_compressed_bytes_read =
         pzStack_38->zipx_ppmd_read_compressed + pzStack_38->entry_compressed_bytes_read;
    pzStack_38->entry_uncompressed_bytes_read =
         bytes_avail + pzStack_38->entry_uncompressed_bytes_read;
    if (pzStack_38->end_of_entry != '\0') {
      Ppmd8_Free(&pzStack_38->ppmd8);
      pzStack_38->ppmd8_valid = '\0';
    }
    *size_local = (size_t)pzStack_38->uncompressed_buffer;
    *offset_local = bytes_avail;
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
zip_read_data_zipx_ppmd(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip* zip = (struct zip *)(a->format->data);
	int ret;
	size_t consumed_bytes = 0;
	ssize_t bytes_avail = 0;

	(void) offset; /* UNUSED */

	/* If we're here for the first time, initialize Ppmd8 decompression
	 * context first. */
	if(!zip->decompress_init) {
		ret = zipx_ppmd8_init(a, zip);
		if(ret != ARCHIVE_OK)
			return ret;
	}

	/* Fetch for more data. We're reading 1 byte here, but libarchive
	 * should prefetch more bytes. */
	(void) __archive_read_ahead(a, 1, &bytes_avail);
	if(bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated PPMd8 file body");
		return (ARCHIVE_FATAL);
	}

	/* This counter will be updated inside ppmd_read(), which at one
	 * point will be called by Ppmd8_DecodeSymbol. */
	zip->zipx_ppmd_read_compressed = 0;

	/* Decompression loop. */
	do {
		int sym = __archive_ppmd8_functions.Ppmd8_DecodeSymbol(
		    &zip->ppmd8);
		if(sym < 0) {
			zip->end_of_entry = 1;
			break;
		}

		/* This field is set by ppmd_read() when there was no more data
		 * to be read. */
		if(zip->ppmd8_stream_failed) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated PPMd8 file body");
			return (ARCHIVE_FATAL);
		}

		zip->uncompressed_buffer[consumed_bytes] = (uint8_t) sym;
		++consumed_bytes;
	} while(consumed_bytes < zip->uncompressed_buffer_size);

	/* Update pointers so we can continue decompression in another call. */
	zip->entry_bytes_remaining -= zip->zipx_ppmd_read_compressed;
	zip->entry_compressed_bytes_read += zip->zipx_ppmd_read_compressed;
	zip->entry_uncompressed_bytes_read += consumed_bytes;

	/* If we're at the end of stream, deinitialize Ppmd8 context. */
	if(zip->end_of_entry) {
		__archive_ppmd8_functions.Ppmd8_Free(&zip->ppmd8);
		zip->ppmd8_valid = 0;
	}

	/* Update pointers for libarchive. */
	*buff = zip->uncompressed_buffer;
	*size = consumed_bytes;

	return ARCHIVE_OK;
}